

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O0

void __thiscall Downloader::startDownload(Downloader *this,QUrl *url)

{
  QPushButton *pQVar1;
  QLabel *pQVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  QNetworkReply *pQVar6;
  QObject local_190 [8];
  QObject local_188 [8];
  QObject local_180 [8];
  QString local_178;
  QString local_160;
  QString local_148;
  QString local_130;
  QDateTime local_118 [8];
  QByteArray local_110;
  QByteArray local_f8;
  QVariant local_e0 [32];
  undefined1 local_c0 [8];
  QNetworkRequest request;
  QString local_a0;
  QString local_88;
  QString local_70;
  QString local_58;
  QString local_30;
  QUrl *local_18;
  QUrl *url_local;
  Downloader *this_local;
  
  local_18 = url;
  url_local = (QUrl *)this;
  QProgressBar::setValue((int)(this->m_ui->super_Ui_Downloader).progressBar);
  pQVar1 = (this->m_ui->super_Ui_Downloader).stopButton;
  tr(&local_30,"Stop",(char *)0x0,-1);
  QAbstractButton::setText((QString *)pQVar1);
  QString::~QString(&local_30);
  pQVar2 = (this->m_ui->super_Ui_Downloader).downloadLabel;
  tr(&local_58,"Downloading updates",(char *)0x0,-1);
  QLabel::setText((QString *)pQVar2);
  QString::~QString(&local_58);
  pQVar2 = (this->m_ui->super_Ui_Downloader).timeLabel;
  tr(&local_a0,"Time remaining",(char *)0x0,-1);
  operator+(&local_88,&local_a0,": ");
  tr((QString *)&request,"unknown",(char *)0x0,-1);
  operator+(&local_70,&local_88,(QString *)&request);
  QLabel::setText((QString *)pQVar2);
  QString::~QString(&local_70);
  QString::~QString((QString *)&request);
  QString::~QString(&local_88);
  QString::~QString(&local_a0);
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)local_c0,(QUrl *)local_18);
  QVariant::QVariant(local_e0,1);
  QNetworkRequest::setAttribute((Attribute)local_c0,(QVariant *)0x16);
  QVariant::~QVariant(local_e0);
  QNetworkRequest::setTransferTimeout((int)local_c0);
  bVar3 = QString::isEmpty(&this->m_userAgentString);
  if (!bVar3) {
    QByteArray::QByteArray(&local_f8,"User-Agent",-1);
    QString::toUtf8(&local_110,&this->m_userAgentString);
    QNetworkRequest::setRawHeader((QByteArray *)local_c0,&local_f8);
    QByteArray::~QByteArray(&local_110);
    QByteArray::~QByteArray(&local_f8);
  }
  pQVar6 = (QNetworkReply *)QNetworkAccessManager::get((QNetworkRequest *)this->m_manager);
  this->m_reply = pQVar6;
  QDateTime::currentDateTime();
  uVar5 = QDateTime::toSecsSinceEpoch();
  this->m_startTime = uVar5;
  QDateTime::~QDateTime(local_118);
  bVar4 = QDir::exists();
  if ((bVar4 & 1) == 0) {
    QString::QString(&local_130,".");
    QDir::mkpath((QString *)&this->m_downloadDir);
    QString::~QString(&local_130);
  }
  QDir::filePath((QString *)&local_148);
  QFile::remove((QString *)&local_148);
  QString::~QString(&local_148);
  operator+(&local_178,&this->m_fileName,&PARTIAL_DOWN);
  QDir::filePath((QString *)&local_160);
  QFile::remove((QString *)&local_160);
  QString::~QString(&local_160);
  QString::~QString(&local_178);
  QObject::connect(local_180,(char *)this->m_reply,(QObject *)"2metaDataChanged()",(char *)this,
                   0x121bae);
  QMetaObject::Connection::~Connection((Connection *)local_180);
  QObject::connect(local_188,(char *)this->m_reply,(QObject *)"2downloadProgress(qint64, qint64)",
                   (char *)this,0x121be3);
  QMetaObject::Connection::~Connection((Connection *)local_188);
  QObject::connect(local_190,(char *)this->m_reply,(QObject *)"2finished()",(char *)this,0x121c0f);
  QMetaObject::Connection::~Connection((Connection *)local_190);
  QWidget::showNormal();
  QNetworkRequest::~QNetworkRequest((QNetworkRequest *)local_c0);
  return;
}

Assistant:

void Downloader::startDownload(const QUrl &url)
{
   /* Reset UI */
   m_ui->progressBar->setValue(0);
   m_ui->stopButton->setText(tr("Stop"));
   m_ui->downloadLabel->setText(tr("Downloading updates"));
   m_ui->timeLabel->setText(tr("Time remaining") + ": " + tr("unknown"));

   /* Configure the network request */
   QNetworkRequest request(url);

   request.setAttribute(QNetworkRequest::RedirectPolicyAttribute, QNetworkRequest::NoLessSafeRedirectPolicy);
   
#if (QT_VERSION >= QT_VERSION_CHECK(5, 15, 0))
   /* 10s timeout */
   request.setTransferTimeout(10000);
#endif

   if (!m_userAgentString.isEmpty())
      request.setRawHeader("User-Agent", m_userAgentString.toUtf8());

   /* Start download */
   m_reply = m_manager->get(request);
   m_startTime = QDateTime::currentDateTime().toSecsSinceEpoch();

   /* Ensure that downloads directory exists */
   if (!m_downloadDir.exists())
      m_downloadDir.mkpath(".");

   /* Remove old downloads */
   QFile::remove(m_downloadDir.filePath(m_fileName));
   QFile::remove(m_downloadDir.filePath(m_fileName + PARTIAL_DOWN));

   /* Update UI when download progress changes or download finishes */
   connect(m_reply, SIGNAL(metaDataChanged()), this, SLOT(metaDataChanged()));
   connect(m_reply, SIGNAL(downloadProgress(qint64, qint64)), this, SLOT(updateProgress(qint64, qint64)));
   connect(m_reply, SIGNAL(finished()), this, SLOT(finished()));

   showNormal();
}